

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O2

void FACT_INTERNAL_OnBufferEnd(FAudioVoiceCallback *callback,void *pContext)

{
  code cVar1;
  uint uVar2;
  OnBufferEndFunc p_Var3;
  long *plVar4;
  long lVar5;
  uint uVar6;
  FAudioBufferWMA *pBufferWMA;
  int iVar7;
  uint uVar8;
  FAudioSourceVoice *voice;
  long lVar9;
  uint32_t len;
  FAudioBuffer local_5c;
  FAudioBufferWMA bufferWMA;
  
  p_Var3 = callback[1].OnBufferEnd;
  plVar4 = *(long **)p_Var3;
  lVar9 = (ulong)*(ushort *)(p_Var3 + 0x10) * 0x18 + plVar4[7];
  if ((p_Var3[0x2a] != (_func_void_FAudioVoiceCallback_ptr_void_ptr)0x0) &&
     (*(int *)(lVar9 + 0x14) != 0)) {
    uVar6 = *(int *)(lVar9 + 0x14) + *(int *)(lVar9 + 0x10);
    uVar2 = *(uint *)(lVar9 + 4);
    if ((uVar2 & 3) == 2) {
      uVar8 = uVar2 >> 0x17 & 0xff;
      iVar7 = (uVar2 >> 2 & 7) * (uVar8 + 0x16) * (uVar6 / (uVar8 * 2 + 0x20));
      goto LAB_0010ec7f;
    }
    if ((uVar2 & 3) == 0) {
      iVar7 = (uVar2 >> 2 & 7) * uVar6 << (byte)(uVar2 >> 0x1f);
      goto LAB_0010ec7f;
    }
  }
  iVar7 = *(int *)(lVar9 + 0xc);
LAB_0010ec7f:
  uVar6 = iVar7 + *(int *)(lVar9 + 8);
  uVar2 = *(uint *)(p_Var3 + 0x30);
  len = uVar6 - uVar2;
  if ((uVar2 <= uVar6 && len != 0) && (((byte)p_Var3[0x20] & 0x20) == 0)) {
    local_5c.pAudioData = *(uint8_t **)(p_Var3 + 0x38);
    if (*(uint *)(p_Var3 + 0x2c) < len) {
      len = *(uint *)(p_Var3 + 0x2c);
    }
    lVar5 = *plVar4;
    local_5c.AudioBytes = len;
    FACT_INTERNAL_ReadFile
              (*(FACTReadFileCallback *)(lVar5 + 0x10),
               *(FACTGetOverlappedResultCallback *)(lVar5 + 0x18),(void *)plVar4[0xe],uVar2,
               *(uint32_t *)(plVar4 + 0xb),(uint8_t **)(plVar4 + 0xc),(uint32_t *)(plVar4 + 0xd),
               *(FAudioReallocFunc *)(lVar5 + 0xd8),local_5c.pAudioData,len);
    p_Var3 = callback[1].OnBufferEnd;
    iVar7 = *(int *)(p_Var3 + 0x30);
    *(uint32_t *)(p_Var3 + 0x30) = len + iVar7;
    local_5c.Flags = 0;
    if (uVar6 <= len + iVar7) {
      cVar1 = p_Var3[0x2a];
      if (cVar1 == (code)0x0) {
        local_5c.Flags = 0x40;
      }
      else {
        if (cVar1 != (code)0xff) {
          p_Var3[0x2a] = (_func_void_FAudioVoiceCallback_ptr_void_ptr)((char)cVar1 + -1);
        }
        iVar7 = *(int *)(lVar9 + 8);
        *(int *)(p_Var3 + 0x30) = iVar7;
        uVar2 = *(uint *)(lVar9 + 4);
        if ((uVar2 & 3) == 2) {
          uVar6 = uVar2 >> 0x17 & 0xff;
          *(uint *)(p_Var3 + 0x30) =
               (uVar2 >> 2 & 7) * (uVar6 + 0x16) * (*(uint *)(lVar9 + 0x10) / (uVar6 * 2 + 0x20)) +
               iVar7;
        }
        else if ((uVar2 & 3) == 0) {
          *(uint *)(p_Var3 + 0x30) =
               ((uVar2 >> 2 & 7) * *(int *)(lVar9 + 0x10) << (byte)(uVar2 >> 0x1f)) + iVar7;
        }
      }
    }
    local_5c.LoopCount = 0;
    local_5c.pContext = (void *)0x0;
    local_5c.PlayBegin = 0;
    local_5c.PlayLength = 0;
    local_5c.LoopBegin = 0;
    local_5c.LoopLength = 0;
    if ((~*(uint *)(lVar9 + 4) & 3) == 0) {
      bufferWMA.pDecodedPacketCumulativeBytes =
           *(uint32_t **)
            (*(long *)(*(long *)p_Var3 + 0x48) + 8 + (ulong)*(ushort *)(p_Var3 + 0x10) * 0x10);
      pBufferWMA = &bufferWMA;
      bufferWMA.PacketCount =
           *(uint32_t *)
            (*(long *)(*(long *)p_Var3 + 0x48) + (ulong)*(ushort *)(p_Var3 + 0x10) * 0x10);
      voice = *(FAudioSourceVoice **)(p_Var3 + 0x48);
    }
    else {
      voice = *(FAudioSourceVoice **)(p_Var3 + 0x48);
      pBufferWMA = (FAudioBufferWMA *)0x0;
    }
    FAudioSourceVoice_SubmitSourceBuffer(voice,&local_5c,pBufferWMA);
  }
  return;
}

Assistant:

void FACT_INTERNAL_OnBufferEnd(FAudioVoiceCallback *callback, void* pContext)
{
	FAudioBuffer buffer;
	FAudioBufferWMA bufferWMA;
	FACTWaveCallback *c = (FACTWaveCallback*) callback;
	FACTWaveBankEntry *entry;
	uint32_t end, left, length;

	entry = &c->wave->parentBank->entries[c->wave->index];

	/* Calculate total bytes left in this wave iteration */
	if (c->wave->loopCount > 0 && entry->LoopRegion.dwTotalSamples > 0)
	{
		length = entry->LoopRegion.dwStartSample + entry->LoopRegion.dwTotalSamples;
		if (entry->Format.wFormatTag == 0x0)
		{
			length = (
				length *
				entry->Format.nChannels *
				(1 << entry->Format.wBitsPerSample)
			);
		}
		else if (entry->Format.wFormatTag == 0x2)
		{
			length = (
				length /
				/* wSamplesPerBlock */
				((entry->Format.wBlockAlign + 16) * 2) *
				/* nBlockAlign */
				((entry->Format.wBlockAlign + 22) * entry->Format.nChannels)
			);
		}
		else
		{
			length = entry->PlayRegion.dwLength;
		}
	}
	else
	{
		length = entry->PlayRegion.dwLength;
	}
	end = entry->PlayRegion.dwOffset + length;
	left = length - (c->wave->streamOffset - entry->PlayRegion.dwOffset);

	/* Don't bother if we're EOS or the Wave has stopped */
	if (	(c->wave->streamOffset >= end) ||
		(c->wave->state & FACT_STATE_STOPPED)	)
	{
		return;
	}

	/* Assign buffer memory */
	buffer.pAudioData = c->wave->streamCache;
	buffer.AudioBytes = FAudio_min(
		c->wave->streamSize,
		left
	);

	/* Read! */
	FACT_INTERNAL_ReadFile(
		c->wave->parentBank->parentEngine->pReadFile,
		c->wave->parentBank->parentEngine->pGetOverlappedResult,
		c->wave->parentBank->io,
		c->wave->streamOffset,
		c->wave->parentBank->packetSize,
		&c->wave->parentBank->packetBuffer,
		&c->wave->parentBank->packetBufferLen,
		c->wave->parentBank->parentEngine->pRealloc,
		c->wave->streamCache,
		buffer.AudioBytes
	);
	c->wave->streamOffset += buffer.AudioBytes;

	/* Last buffer in the stream? */
	buffer.Flags = 0;
	if (c->wave->streamOffset >= end)
	{
		/* Loop if applicable */
		if (c->wave->loopCount > 0)
		{
			if (c->wave->loopCount != 255)
			{
				c->wave->loopCount -= 1;
			}
			c->wave->streamOffset = entry->PlayRegion.dwOffset;

			/* Loop start */
			if (entry->Format.wFormatTag == 0x0)
			{
				c->wave->streamOffset += (
					entry->LoopRegion.dwStartSample *
					entry->Format.nChannels *
					(1 << entry->Format.wBitsPerSample)
				);
			}
			else if (entry->Format.wFormatTag == 0x2)
			{
				c->wave->streamOffset += (
					entry->LoopRegion.dwStartSample /
					/* wSamplesPerBlock */
					((entry->Format.wBlockAlign + 16) * 2) *
					/* nBlockAlign */
					((entry->Format.wBlockAlign + 22) * entry->Format.nChannels)
				);
			}
		}
		else
		{
			buffer.Flags = FAUDIO_END_OF_STREAM;
		}
	}

	/* Unused properties */
	buffer.PlayBegin = 0;
	buffer.PlayLength = 0;
	buffer.LoopBegin = 0;
	buffer.LoopLength = 0;
	buffer.LoopCount = 0;
	buffer.pContext = NULL;

	/* Submit, finally. */
	if (entry->Format.wFormatTag == 0x3)
	{
		bufferWMA.pDecodedPacketCumulativeBytes =
			c->wave->parentBank->seekTables[c->wave->index].entries;
		bufferWMA.PacketCount =
			c->wave->parentBank->seekTables[c->wave->index].entryCount;
		FAudioSourceVoice_SubmitSourceBuffer(
			c->wave->voice,
			&buffer,
			&bufferWMA
		);
	}
	else
	{
		FAudioSourceVoice_SubmitSourceBuffer(
			c->wave->voice,
			&buffer,
			NULL
		);
	}
}